

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_models.c
# Opt level: O1

uint8_t s390_get_mha_pow(void)

{
  uint8_t uVar1;
  
  if (s390_get_mha_pow::cpu == (S390CPU *)0x0) {
    s390_get_mha_pow::cpu = (S390CPU *)qemu_get_cpu_s390x((uc_struct_conflict14 *)0x0,0);
  }
  if ((s390_get_mha_pow::cpu == (S390CPU *)0x0) ||
     (s390_get_mha_pow::cpu->model == (S390CPUModel *)0x0)) {
    uVar1 = '\0';
  }
  else {
    uVar1 = s390_get_mha_pow::cpu->model->def->mha_pow;
  }
  return uVar1;
}

Assistant:

uint8_t s390_get_mha_pow(void)
{
    static S390CPU *cpu;

    if (!cpu) {
        cpu = S390_CPU(qemu_get_cpu(NULL, 0));
    }

    if (!cpu || !cpu->model) {
        return 0;
    }
    return cpu->model->def->mha_pow;
}